

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result __thiscall wabt::TypeChecker::OnBrTableTarget(TypeChecker *this,Index depth)

{
  bool bVar1;
  Result RVar2;
  TypeVector *prefix;
  Enum EVar3;
  _anonymous_namespace_ *__x;
  _anonymous_namespace_ *this_00;
  string local_78;
  string local_58;
  Label *local_38;
  Label *label;
  
  RVar2 = GetLabel(this,depth,&local_38);
  EVar3 = Error;
  if (RVar2.enum_ != Error) {
    prefix = &local_38->param_types;
    this_00 = (_anonymous_namespace_ *)&local_38->result_types;
    if (local_38->label_type == Loop) {
      this_00 = (_anonymous_namespace_ *)prefix;
    }
    RVar2 = CheckSignature(this,(TypeVector *)this_00,"br_table");
    __x = (_anonymous_namespace_ *)this->br_table_sig_;
    if ((_anonymous_namespace_ *)this->br_table_sig_ == (_anonymous_namespace_ *)0x0) {
      this->br_table_sig_ = (TypeVector *)this_00;
      __x = this_00;
    }
    bVar1 = std::operator!=((vector<wabt::Type,_std::allocator<wabt::Type>_> *)__x,
                            (vector<wabt::Type,_std::allocator<wabt::Type>_> *)this_00);
    if (bVar1) {
      (anonymous_namespace)::TypesToString_abi_cxx11_
                (&local_78,(_anonymous_namespace_ *)this->br_table_sig_,(TypeVector *)0x0,
                 (char *)prefix);
      (anonymous_namespace)::TypesToString_abi_cxx11_
                (&local_58,this_00,(TypeVector *)0x0,(char *)prefix);
      PrintError(this,"br_table labels have inconsistent types: expected %s, got %s",
                 local_78._M_dataplus._M_p,local_58._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_78);
    }
    else {
      EVar3 = (Enum)(RVar2.enum_ == Error);
    }
  }
  return (Result)EVar3;
}

Assistant:

Result TypeChecker::OnBrTableTarget(Index depth) {
  Result result = Result::Ok;
  Label* label;
  CHECK_RESULT(GetLabel(depth, &label));
  TypeVector& label_sig = label->br_types();
  result |= CheckSignature(label_sig, "br_table");

  // Make sure this label's signature is consistent with the previous labels'
  // signatures.
  if (br_table_sig_ == nullptr) {
    br_table_sig_ = &label_sig;
  }
  if (*br_table_sig_ != label_sig) {
    result |= Result::Error;
    PrintError("br_table labels have inconsistent types: expected %s, got %s",
               TypesToString(*br_table_sig_).c_str(),
               TypesToString(label_sig).c_str());
  }

  return result;
}